

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Signature.hpp
# Opt level: O0

void __thiscall Kernel::Signature::RealSymbol::RealSymbol(RealSymbol *this,RealConstantType *val)

{
  Proof PVar1;
  TermList resultSort;
  OperatorType *type;
  bool in_stack_00000051;
  bool in_stack_00000052;
  bool in_stack_00000053;
  uint in_stack_00000054;
  RealConstantType *in_stack_00000148;
  char (*in_stack_00000158) [2];
  RealConstantType *in_stack_00000160;
  char (*in_stack_00000168) [10];
  RealConstantType *in_stack_ffffffffffffff98;
  uint taArity;
  RealConstantType *in_stack_ffffffffffffffa0;
  string local_30 [48];
  
  PVar1 = Shell::Options::proof(Lib::env);
  if (PVar1 == PROOFCHECK) {
    Lib::Output::toString<char[10],Kernel::RealConstantType,char[2]>
              (in_stack_00000168,in_stack_00000160,in_stack_00000158);
  }
  else {
    Lib::Output::toString<Kernel::RealConstantType>(in_stack_00000148);
  }
  Symbol::Symbol(&this->super_Symbol,(string *)val,in_stack_00000054,in_stack_00000053,
                 in_stack_00000052,in_stack_00000051);
  std::__cxx11::string::~string(local_30);
  RealConstantType::RealConstantType(in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  taArity = (uint)((ulong)in_stack_ffffffffffffff98 >> 0x20);
  resultSort = AtomicSort::realSort();
  type = OperatorType::getConstantsType(resultSort,taArity);
  Symbol::setType((Symbol *)resultSort._content,type);
  return;
}

Assistant:

RealSymbol(const RealConstantType& val)
    : Symbol((env.options->proof() == Shell::Options::Proof::PROOFCHECK) ? Output::toString("$to_real(",val,")") 
                                                                         : Output::toString(val),
        /*             arity */ 0, 
        /*       interpreted */ true, 
        /*    preventQuoting */ false, 
        /*             super */ false),
       _realValue(std::move(val))
    {
      setType(OperatorType::getConstantsType(AtomicSort::realSort()));
    }